

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

void __thiscall mprpc::MpRpcClient::do_send_heartbeat(MpRpcClient *this)

{
  uint uVar1;
  element_type *peVar2;
  uint64_t val;
  undefined1 local_88 [8];
  MsgPackPacker pk;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58 [3];
  undefined1 local_40 [8];
  MsgPackPacker pk_params;
  int callid;
  MpRpcClient *this_local;
  
  peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_conn);
  uVar1 = (*peVar2->_vptr_Connection[7])();
  if ((uVar1 & 1) != 0) {
    pk_params.pk.callback._4_4_ =
         std::__atomic_base<int>::operator++(&(this->m_cur_callid).super___atomic_base<int>);
    MsgPackPacker::MsgPackPacker((MsgPackPacker *)local_40);
    MsgPackPacker::pack_map((MsgPackPacker *)local_40,1);
    pk.pk.callback = (msgpack_packer_write)std::chrono::_V2::system_clock::now();
    local_58[0].__r =
         (rep)std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&pk.pk.callback);
    val = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_58);
    MsgPackPacker::pack_map_item((MsgPackPacker *)local_40,"time",val);
    MsgPackPacker::MsgPackPacker((MsgPackPacker *)local_88);
    MsgPackPacker::pack_map((MsgPackPacker *)local_88,3);
    MsgPackPacker::pack_map_item((MsgPackPacker *)local_88,"id",pk_params.pk.callback._4_4_);
    MsgPackPacker::pack_map_item((MsgPackPacker *)local_88,"method",".sys.heartbeat");
    MsgPackPacker::pack_map_item_obj
              ((MsgPackPacker *)local_88,"params",(char *)pk_params.sb.size,(size_t)local_40);
    peVar2 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->m_conn);
    (*peVar2->_vptr_Connection[5])(peVar2,pk.sb.size,local_88);
    MsgPackPacker::~MsgPackPacker((MsgPackPacker *)local_88);
    MsgPackPacker::~MsgPackPacker((MsgPackPacker *)local_40);
  }
  return;
}

Assistant:

void MpRpcClient::do_send_heartbeat()
    {
        if (!m_conn->is_connected()) return;

        int callid = ++m_cur_callid;

        MsgPackPacker pk_params;
        pk_params.pack_map(1);
        pk_params.pack_map_item("time", (uint64_t)system_clock::now().time_since_epoch().count());
         
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item    ("id",     callid);
        pk.pack_map_item    ("method", ".sys.heartbeat");
        pk.pack_map_item_obj("params", pk_params.sb.data, pk_params.sb.size);

        m_conn->send(pk.sb.data, pk.sb.size);
    }